

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_2d65b::CleanTest::~CleanTest(CleanTest *this)

{
  CleanTest *this_local;
  
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__CleanTest_002608e0;
  VirtualFileSystem::~VirtualFileSystem(&this->fs_);
  StateTestWithBuiltinRules::~StateTestWithBuiltinRules(&this->super_StateTestWithBuiltinRules);
  return;
}

Assistant:

virtual void SetUp() {
    config_.verbosity = BuildConfig::QUIET;
  }